

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double betaln(double *a0,double *b0)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_30;
  double local_28;
  
  betaln::a = *a0;
  if (*b0 <= *a0) {
    betaln::a = *b0;
  }
  betaln::b = *b0;
  if (*b0 <= *a0) {
    betaln::b = *a0;
  }
  if (8.0 <= betaln::a) {
    betaln::w = bcorr(&betaln::a,&betaln::b);
    betaln::h = betaln::a / betaln::b;
    dVar5 = betaln::a + -0.5;
    dVar3 = log(betaln::h / (betaln::h + 1.0));
    dVar2 = betaln::b;
    betaln::u = -dVar5 * dVar3;
    dVar5 = alnrel(&betaln::h);
    dVar3 = betaln::u;
    betaln::v = dVar5 * dVar2;
    dVar4 = log(betaln::b);
    dVar4 = dVar4 * -0.5 + 0.918938533204673 + betaln::w;
    if (dVar5 * dVar2 < dVar3) {
      return (dVar4 - betaln::v) - betaln::u;
    }
    return (dVar4 - betaln::u) - betaln::v;
  }
  if (betaln::a < 1.0) {
    if (betaln::b < 8.0) {
      betaln::T1 = betaln::a + betaln::b;
      local_30 = gamln(&betaln::a);
      dVar2 = gamln(&betaln::b);
      dVar3 = gamln(&betaln::T1);
      dVar2 = dVar2 - dVar3;
      goto LAB_001041b6;
    }
LAB_00103f4c:
    local_28 = gamln(&betaln::a);
    dVar3 = algdiv(&betaln::a,&betaln::b);
LAB_0010408c:
    return dVar3 + local_28;
  }
  if (betaln::a <= 2.0) {
    if (betaln::b <= 2.0) {
      dVar2 = gamln(&betaln::a);
      dVar3 = gamln(&betaln::b);
      dVar5 = gsumln(&betaln::a,&betaln::b);
      return (dVar3 + dVar2) - dVar5;
    }
    betaln::w = 0.0;
    if (8.0 <= betaln::b) goto LAB_00103f4c;
  }
  else {
    betaln::n = (int)(betaln::a + -1.0);
    if (1000.0 < betaln::b) {
      betaln::w = 1.0;
      if (0 < betaln::n) {
        betaln::w = 1.0;
        iVar1 = betaln::n;
        do {
          betaln::a = betaln::a + -1.0;
          betaln::w = betaln::w * (betaln::a / (betaln::a / betaln::b + 1.0));
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      local_28 = log(betaln::w);
      dVar2 = (double)betaln::n;
      dVar3 = log(betaln::b);
      local_28 = local_28 - dVar3 * dVar2;
      dVar2 = gamln(&betaln::a);
      dVar3 = algdiv(&betaln::a,&betaln::b);
      dVar3 = dVar3 + dVar2;
      goto LAB_0010408c;
    }
    if (betaln::n < 1) {
      dVar2 = 1.0;
    }
    else {
      dVar2 = 1.0;
      iVar1 = betaln::n;
      do {
        betaln::a = betaln::a + -1.0;
        betaln::h = betaln::a / betaln::b;
        dVar2 = dVar2 * (betaln::h / (betaln::h + 1.0));
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    local_30 = log(dVar2);
    betaln::w = local_30;
    if (8.0 <= betaln::b) {
      dVar2 = gamln(&betaln::a);
      local_30 = local_30 + dVar2;
      dVar2 = algdiv(&betaln::a,&betaln::b);
      goto LAB_001041b6;
    }
  }
  local_30 = betaln::w;
  betaln::n = (int)(betaln::b + -1.0);
  dVar2 = 1.0;
  iVar1 = betaln::n;
  if (0 < betaln::n) {
    do {
      betaln::b = betaln::b + -1.0;
      dVar2 = dVar2 * (betaln::b / (betaln::b + betaln::a));
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  dVar2 = log(dVar2);
  local_30 = local_30 + dVar2;
  dVar2 = gamln(&betaln::a);
  dVar3 = gamln(&betaln::b);
  dVar5 = gsumln(&betaln::a,&betaln::b);
  dVar2 = (dVar3 - dVar5) + dVar2;
LAB_001041b6:
  return dVar2 + local_30;
}

Assistant:

double betaln(double *a0,double *b0)
/*
-----------------------------------------------------------------------
     EVALUATION OF THE LOGARITHM OF THE BETA FUNCTION
-----------------------------------------------------------------------
     E = 0.5*LN(2*PI)
--------------------------
*/
{
static double e = .918938533204673e0;
static double betaln,a,b,c,h,u,v,w,z;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    a = fifdmin1(*a0,*b0);
    b = fifdmax1(*a0,*b0);
    if(a >= 8.0e0) goto S100;
    if(a >= 1.0e0) goto S20;
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .LT. 1
-----------------------------------------------------------------------
*/
    if(b >= 8.0e0) goto S10;
    T1 = a+b;
    betaln = gamln(&a)+(gamln(&b)-gamln(&T1));
    return betaln;
S10:
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S20:
/*
-----------------------------------------------------------------------
                PROCEDURE WHEN 1 .LE. A .LT. 8
-----------------------------------------------------------------------
*/
    if(a > 2.0e0) goto S40;
    if(b > 2.0e0) goto S30;
    betaln = gamln(&a)+gamln(&b)-gsumln(&a,&b);
    return betaln;
S30:
    w = 0.0e0;
    if(b < 8.0e0) goto S60;
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S40:
/*
                REDUCTION OF A WHEN B .LE. 1000
*/
    if(b > 1000.0e0) goto S80;
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        h = a/b;
        w *= (h/(1.0e0+h));
    }
    w = log(w);
    if(b < 8.0e0) goto S60;
    betaln = w+gamln(&a)+algdiv(&a,&b);
    return betaln;
S60:
/*
                 REDUCTION OF B WHEN B .LT. 8
*/
    n = b-1.0e0;
    z = 1.0e0;
    for(i=1; i<=n; i++) {
        b -= 1.0e0;
        z *= (b/(a+b));
    }
    betaln = w+log(z)+(gamln(&a)+(gamln(&b)-gsumln(&a,&b)));
    return betaln;
S80:
/*
                REDUCTION OF A WHEN B .GT. 1000
*/
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        w *= (a/(1.0e0+a/b));
    }
    betaln = log(w)-(double)n*log(b)+(gamln(&a)+algdiv(&a,&b));
    return betaln;
S100:
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .GE. 8
-----------------------------------------------------------------------
*/
    w = bcorr(&a,&b);
    h = a/b;
    c = h/(1.0e0+h);
    u = -((a-0.5e0)*log(c));
    v = b*alnrel(&h);
    if(u <= v) goto S110;
    betaln = -(0.5e0*log(b))+e+w-v-u;
    return betaln;
S110:
    betaln = -(0.5e0*log(b))+e+w-u-v;
    return betaln;
}